

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_argv.c
# Opt level: O2

ssize_t mpt_message_argv(mpt_message *msg,int sep)

{
  ulong uVar1;
  ssize_t sVar2;
  ulong uVar3;
  ushort **ppuVar4;
  iovec *piVar5;
  size_t ndat;
  iovec curr;
  
  curr.iov_base = msg->base;
  curr.iov_len = msg->used;
  while (curr.iov_len == 0) {
    if (msg->clen == 0) {
      return -0x10;
    }
    piVar5 = msg->cont;
    curr.iov_base = piVar5->iov_base;
    msg->base = curr.iov_base;
    curr.iov_len = piVar5->iov_len;
    msg->used = curr.iov_len;
    msg->cont = piVar5 + 1;
    msg->clen = msg->clen - 1;
  }
  piVar5 = msg->cont;
  ndat = msg->clen;
  if (sep == 0) {
    sep = 0;
  }
  else {
    sVar2 = mpt_memfcn(&curr,1,notSpace,(void *)0x0);
    if (sVar2 < 0) {
      uVar3 = mpt_memfcn(piVar5,ndat,notSpace,(void *)0x0);
      if (-1 < (long)uVar3) {
        while( true ) {
          uVar1 = piVar5->iov_len;
          if (uVar3 < uVar1 || uVar3 - uVar1 == 0) break;
          ndat = ndat - 1;
          piVar5 = piVar5 + 1;
          uVar3 = uVar3 - uVar1;
        }
        curr.iov_len = uVar1 - uVar3;
        curr.iov_base = (void *)(uVar3 + (long)piVar5->iov_base);
        msg->base = curr.iov_base;
        msg->used = curr.iov_len;
        msg->cont = piVar5;
        msg->clen = ndat;
      }
    }
    else {
      curr.iov_base = (void *)((long)curr.iov_base + sVar2);
      msg->base = curr.iov_base;
      curr.iov_len = curr.iov_len - sVar2;
      msg->used = curr.iov_len;
    }
    ppuVar4 = __ctype_b_loc();
    if (-1 < (short)(*ppuVar4)[sep]) {
      sep = 0;
      sVar2 = mpt_memtok(&curr,1,"\t \n\r\v",(char *)0x0,"\'\"");
      if (-1 < sVar2) {
        return sVar2;
      }
      if (ndat != 0) {
        sep = 0;
        sVar2 = mpt_memtok(piVar5,ndat,"\t \n\r\v",(char *)0x0,"\'\"");
        if (-1 < sVar2) {
          return sVar2 + curr.iov_len;
        }
      }
    }
  }
  sVar2 = nextChar(&curr,piVar5,ndat,sep);
  return sVar2;
}

Assistant:

extern ssize_t mpt_message_argv(MPT_STRUCT(message) *msg, int sep)
{
	struct iovec *cont;
	struct iovec curr;
	ssize_t part;
	size_t  clen;
	
	/* start on base data */
	curr.iov_base = (void *) msg->base;
	while (!(curr.iov_len = msg->used)) {
		if (!msg->clen) {
			return MPT_ERROR(MissingData);
		}
		curr.iov_base = (void *) (msg->base = msg->cont->iov_base);
		curr.iov_len = msg->used = msg->cont->iov_len;
		++msg->cont;
		--msg->clen;
	}
	cont = msg->cont;
	clen = msg->clen;
	
	/* find null character valid memory */
	if (!sep) {
		return nextChar(&curr, cont, clen, sep);
	}
	/* trim leading whitespace */
	if ((part = mpt_memfcn(&curr, 1, notSpace, 0)) >= 0) {
		msg->base = curr.iov_base = ((uint8_t *) curr.iov_base) + part;
		msg->used = curr.iov_len -= part;
	}
	else if ((part = mpt_memfcn(cont, clen, notSpace, 0)) >= 0) {
		while ((size_t) part > cont->iov_len) {
			part -= cont->iov_len;
			--clen;
			++cont;
		}
		msg->base = curr.iov_base = ((uint8_t *) cont->iov_base) + part;
		msg->used = curr.iov_len  = cont->iov_len - part;
		msg->cont = cont;
		msg->clen = clen;
	}
	/* find space character not in escapes */
	if (!isgraph(sep)) {
		if ((part = mpt_memtok(&curr, 1, "\t \n\r\v", NULL, "'\"")) >= 0) {
			return part;
		}
		if (clen && (part = mpt_memtok(cont, clen, "\t \n\r\v", NULL, "'\"")) >= 0) {
			return curr.iov_len + part;
		}
		sep = 0;
	}
	/* check for termination */
	return nextChar(&curr, cont, clen, sep);
}